

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_port.hpp
# Opt level: O0

FILE * iutest::internal::posix::FileOpen(char *filename,char *mode)

{
  FILE *pFVar1;
  char *mode_local;
  char *filename_local;
  
  pFVar1 = fopen64(filename,mode);
  return (FILE *)pFVar1;
}

Assistant:

inline FILE* FileOpen(const char* filename, const char* mode)
{
#if defined(_MSC_VER)
IUTEST_PRAGMA_CRT_SECURE_WARN_DISABLE_BEGIN()
    return fopen(filename, mode);
IUTEST_PRAGMA_CRT_SECURE_WARN_DISABLE_END()
#elif defined(_LARGEFILE64_SOURCE)
    return fopen64(filename, mode);
#else
    return fopen(filename, mode);
#endif
}